

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDEdgeSharpness ON_SubDEdgeSharpness::FromConstant(double sharpness)

{
  float fVar1;
  double dVar2;
  ON_SubDEdgeSharpness OVar3;
  
  if ((sharpness < 0.0) || (4.0 < sharpness)) {
    fVar1 = ON_FLT_QNAN;
    if ((sharpness == 5.0) && (!NAN(sharpness))) {
      fVar1 = 5.0;
    }
  }
  else {
    dVar2 = Sanitize(sharpness,0.0);
    fVar1 = (float)dVar2;
  }
  OVar3.m_edge_sharpness[1] = fVar1;
  OVar3.m_edge_sharpness[0] = fVar1;
  return (ON_SubDEdgeSharpness)OVar3.m_edge_sharpness;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdgeSharpness::FromConstant(
  double sharpness
)
{
  ON_SubDEdgeSharpness s;
  s.m_edge_sharpness[0] 
    = (sharpness >= 0.0 && sharpness  <= ON_SubDEdgeSharpness::MaximumValue) 
    ? ((float)ON_SubDEdgeSharpness::Sanitize(sharpness, 0.0)) 
    : (ON_SubDEdgeSharpness::CreaseValue == sharpness ? ((float)ON_SubDEdgeSharpness::CreaseValue) : ON_FLT_QNAN);
  s.m_edge_sharpness[1] = s.m_edge_sharpness[0];
  return s;
}